

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_vault_type(chunk *c,loc_conflict centre,char *typ)

{
  _Bool _Var1;
  vault *v;
  
  v = random_vault(c->depth,typ);
  if ((v != (vault *)0x0) && (_Var1 = build_vault(c,centre,v), _Var1)) {
    if ((player->opts).opt[0x18] == true) {
      msg("%s (%s)",typ,v->name);
    }
    add_to_monster_rating(c,(uint)v->rat);
    return true;
  }
  return false;
}

Assistant:

static bool build_vault_type(struct chunk *c, struct loc centre,
							 const char *typ)
{
	struct vault *v = random_vault(c->depth, typ);
	if (v == NULL) {
		/*quit_fmt("got NULL from random_vault(%s)", typ);*/
		return false;
	}

	/* Build the vault */
	if (!build_vault(c, centre, v))
		return false;

	ROOM_LOG("%s (%s)", typ, v->name);

	/* Boost the rating */
	add_to_monster_rating(c, v->rat);

	return true;
}